

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::btranFT(HFactor *this,HVector *vector)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  long in_RSI;
  long in_RDI;
  double dVar13;
  double value1;
  double value0;
  int iRow;
  int k;
  int end;
  int start;
  double pivotX;
  int pivotRow;
  int i;
  double RHS_start;
  double *RHSarray;
  int *RHSindex;
  int RHScount;
  int RHS_tick;
  double *PFvalue;
  int *PFindex;
  int *PFstart;
  int *PFpivotIndex;
  int PFpivotCount;
  value_type local_98;
  int local_74;
  int local_5c;
  int local_40;
  int local_3c;
  
  sVar6 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4d8));
  iVar5 = (int)sVar6;
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4d8),0);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4f0),0);
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x508),0);
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x520),0);
  local_3c = *(int *)(in_RSI + 0x38);
  local_40 = *(int *)(in_RSI + 4);
  pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),0);
  pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),0);
  dVar13 = (double)local_3c;
  local_5c = iVar5;
  while (iVar3 = local_5c, local_5c = iVar3 + -1, -1 < local_5c) {
    dVar1 = pvVar12[pvVar7[local_5c]];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      local_74 = pvVar8[local_5c];
      iVar3 = pvVar8[iVar3];
      local_3c = (iVar3 - local_74) + local_3c;
      for (; local_74 < iVar3; local_74 = local_74 + 1) {
        iVar4 = pvVar9[local_74];
        dVar2 = pvVar12[iVar4];
        local_98 = -dVar1 * pvVar10[local_74] + dVar2;
        if ((dVar2 == 0.0) && (!NAN(dVar2))) {
          pvVar11[local_40] = iVar4;
          local_40 = local_40 + 1;
        }
        if (ABS(local_98) < 1e-14) {
          local_98 = 1e-50;
        }
        pvVar12[iVar4] = local_98;
      }
    }
  }
  *(double *)(in_RSI + 0x40) =
       ((double)local_3c - dVar13) * 15.0 + (double)(iVar5 * 10) + *(double *)(in_RSI + 0x40);
  *(int *)(in_RSI + 0x38) = (int)((double)iVar5 * 0.3 + (double)local_3c);
  *(int *)(in_RSI + 4) = local_40;
  return;
}

Assistant:

void HFactor::btranFT(HVector& vector) const {
    // Alias to PF buffer
    const int PFpivotCount = PFpivotIndex.size();
    const int *PFpivotIndex = &this->PFpivotIndex[0];
    const int *PFstart = &this->PFstart[0];
    const int *PFindex = &this->PFindex[0];
    const double *PFvalue = &this->PFvalue[0];

    // Alias to non constant
    int RHS_tick = vector.pseudoTick;
    int RHScount = vector.count;
    int *RHSindex = &vector.index[0];
    double *RHSarray = &vector.array[0];

    // Backwardly apply row ETA
    double RHS_start = RHS_tick;
    for (int i = PFpivotCount - 1; i >= 0; i--) {
        int pivotRow = PFpivotIndex[i];
        double pivotX = RHSarray[pivotRow];
        if (pivotX) {
            const int start = PFstart[i];
            const int end = PFstart[i + 1];
            RHS_tick += end - start;
            for (int k = start; k < end; k++) {
                int iRow = PFindex[k];
                double value0 = RHSarray[iRow];
                double value1 = value0 - pivotX * PFvalue[k];
                if (value0 == 0)
                    RHSindex[RHScount++] = iRow;
                RHSarray[iRow] =
                        (fabs(value1) < HSOL_CONST_TINY) ?
                                HSOL_CONST_ZERO : value1;
            }
        }
    }

    vector.fakeTick += (RHS_tick - RHS_start) * 15 + PFpivotCount * 10;

    // Save count back
    vector.pseudoTick = RHS_tick + PFpivotCount * 0.3;
    vector.count = RHScount;
}